

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O3

void __thiscall
gl3cts::TransformFeedbackOverflowQueryErrorBase::verifyError
          (TransformFeedbackOverflowQueryErrorBase *this,GLenum expectedError)

{
  int iVar1;
  GLenum GVar2;
  undefined4 extraout_var;
  TestError *this_00;
  
  iVar1 = (*((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  GVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (GVar2 == expectedError) {
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,this->m_case_name,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackOverflowQueryTests.cpp"
             ,0x1bf);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void verifyError(GLenum expectedError)
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		GLenum actualError = gl.getError();

		if (actualError != expectedError)
		{
			TCU_FAIL(m_case_name);
		}
	}